

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

NewOrderSingle * __thiscall
Application::queryNewOrderSingle43(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  Application *pAVar2;
  FieldBase *this_00;
  FieldBase *this_01;
  FieldBase *this_02;
  FieldBase *this_03;
  FieldBase *pFVar3;
  OrdType ordType;
  FieldBase FStack_228;
  undefined1 local_1d0 [48];
  _Alloc_hider local_1a0;
  size_type local_198;
  field_metrics local_180;
  FieldBase local_178;
  FieldBase local_120;
  FieldBase local_c8;
  FieldBase local_70;
  
  this_00 = &FStack_228;
  this_01 = &FStack_228;
  this_02 = &FStack_228;
  this_03 = &FStack_228;
  pFVar3 = &FStack_228;
  pAVar2 = (Application *)0x28;
  FIX::CharField::CharField((CharField *)local_1d0,0x28);
  local_1d0._0_8_ = &PTR__FieldBase_00152008;
  queryClOrdID((ClOrdID *)&FStack_228,pAVar2);
  pAVar2 = (Application *)0x15;
  FIX::CharField::CharField((CharField *)&local_120,0x15,'1');
  local_120._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152078;
  querySide((Side *)&local_70,pAVar2);
  FIX::TransactTime::TransactTime((TransactTime *)&local_c8);
  queryOrdType((OrdType *)&local_178,pAVar2);
  local_1d0._8_4_ = local_178.m_tag;
  std::__cxx11::string::_M_assign((string *)(local_1d0 + 0x10));
  local_180 = local_178.m_metrics;
  local_198 = 0;
  *local_1a0._M_p = '\0';
  FIX43::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)&FStack_228,(HandlInst *)&local_120,(Side *)&local_70
             ,(TransactTime *)&local_c8,(OrdType *)local_1d0);
  FIX::FieldBase::~FieldBase(&local_178);
  FIX::FieldBase::~FieldBase(&local_c8);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::FieldBase::~FieldBase(&local_120);
  FIX::FieldBase::~FieldBase(&FStack_228);
  querySymbol((Symbol *)&FStack_228,(Application *)this_00);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&FStack_228,true);
  FIX::FieldBase::~FieldBase(&FStack_228);
  queryOrderQty((OrderQty *)&FStack_228,(Application *)this_01);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&FStack_228,true);
  FIX::FieldBase::~FieldBase(&FStack_228);
  queryTimeInForce((TimeInForce *)&FStack_228,(Application *)this_02);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&FStack_228,true);
  FIX::FieldBase::~FieldBase(&FStack_228);
  cVar1 = FIX::CharField::getValue((CharField *)local_1d0);
  if (cVar1 == '2') {
LAB_001121c4:
    queryPrice((Price *)&FStack_228,(Application *)this_03);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&FStack_228,true);
    FIX::FieldBase::~FieldBase(&FStack_228);
    this_03 = pFVar3;
  }
  else {
    cVar1 = FIX::CharField::getValue((CharField *)local_1d0);
    if (cVar1 == '4') goto LAB_001121c4;
  }
  cVar1 = FIX::CharField::getValue((CharField *)local_1d0);
  if (cVar1 != '3') {
    cVar1 = FIX::CharField::getValue((CharField *)local_1d0);
    if (cVar1 != '4') goto LAB_00112220;
  }
  queryStopPx((StopPx *)&FStack_228,(Application *)this_03);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&FStack_228,true);
  FIX::FieldBase::~FieldBase(&FStack_228);
LAB_00112220:
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1d0);
  return __return_storage_ptr__;
}

Assistant:

FIX43::NewOrderSingle Application::queryNewOrderSingle43() {
  FIX::OrdType ordType;

  FIX43::NewOrderSingle
      newOrderSingle(queryClOrdID(), FIX::HandlInst('1'), querySide(), FIX::TransactTime(), ordType = queryOrdType());

  newOrderSingle.set(querySymbol());
  newOrderSingle.set(queryOrderQty());
  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}